

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raytraced_renderer.cpp
# Opt level: O2

void __thiscall CGL::RaytracedRenderer::update_screen(RaytracedRenderer *this)

{
  State SVar1;
  
  SVar1 = this->state;
  if ((SVar1 == DONE) || (SVar1 == RENDERING)) {
    glDrawPixels((int)(this->frameBuffer).w,(int)(this->frameBuffer).h,0x1908,0x1401,
                 (this->frameBuffer).data.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start);
    if ((this->super_OfflineRenderer).render_cell == true) {
      visualize_cell(this);
      return;
    }
  }
  else if (SVar1 == VISUALIZE) {
    visualize_accel(this);
    return;
  }
  return;
}

Assistant:

void RaytracedRenderer::update_screen() {
  switch (state) {
    case INIT:
    case READY:
      break;
    case VISUALIZE:
      visualize_accel();
      break;
    case RENDERING:
      glDrawPixels(frameBuffer.w, frameBuffer.h, GL_RGBA,
                   GL_UNSIGNED_BYTE, &frameBuffer.data[0]);
      if (render_cell)
        visualize_cell();
      break;
    case DONE:
      glDrawPixels(frameBuffer.w, frameBuffer.h, GL_RGBA,
                   GL_UNSIGNED_BYTE, &frameBuffer.data[0]);
      if (render_cell)
        visualize_cell();
      break;
  }
}